

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void TestEq<long,long>(long expval,long val,char *exp,char *file,int line)

{
  string expval_str;
  string val_str;
  
  if (expval == val) {
    return;
  }
  flatbuffers::NumToString<long>(&expval_str,expval);
  flatbuffers::NumToString<long>(&val_str,val);
  printf("TEST FAILED: %s:%d, %s (%s) != %s",file,line,exp,expval_str._M_dataplus._M_p,
         val_str._M_dataplus._M_p);
  putchar(10);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/tests/test.cpp"
                ,0x2d,"void TestEq(T, U, const char *, const char *, int) [T = long, U = long]");
}

Assistant:

void TestEq(T expval, U val, const char *exp, const char *file, int line) {
  if (expval != val) {
    auto expval_str = flatbuffers::NumToString(expval);
    auto val_str = flatbuffers::NumToString(val);
    TEST_OUTPUT_LINE("TEST FAILED: %s:%d, %s (%s) != %s", file, line,
                     exp, expval_str.c_str(), val_str.c_str());
    assert(0);
    testing_fails++;
  }
}